

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_map_null_equal_null(void)

{
  size_type in_RCX;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *ppVar1;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_220;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_208;
  undefined1 local_1f9;
  basic_variable<std::allocator<char>_> local_1f8;
  int local_1c8 [2];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1c0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1b8;
  undefined1 local_158 [77];
  undefined1 local_10b [2];
  undefined1 local_109;
  basic_variable<std::allocator<char>_> local_108;
  int local_c8 [2];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_c0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_b8;
  undefined1 local_58 [78];
  undefined1 local_a [2];
  
  local_c0 = &local_b8;
  local_c8[1] = 0;
  local_c8[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<trial::dynamic::nullable,_int,_true>(local_c0,(nullable *)(local_c8 + 1),local_c8);
  local_58._0_8_ = &local_b8;
  local_58._8_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10),
             (basic_map<std::allocator<char>_> *)local_58._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_108);
  local_a[0] = trial::dynamic::operator==
                         ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10),&local_108);
  local_109 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {null, 1} }) == variable()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xda5,"void equality_suite::compare_map_null_equal_null()",local_a,&local_109);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10));
  ppVar1 = &local_b8;
  local_208 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_58;
  do {
    local_208 = local_208 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_208);
  } while (local_208 != ppVar1);
  local_1c0 = &local_1b8;
  local_1c8[1] = 0;
  local_1c8[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<trial::dynamic::nullable,_int,_true>(local_1c0,(nullable *)(local_1c8 + 1),local_1c8);
  local_158._0_8_ = &local_1b8;
  local_158._8_8_ = 1;
  init_00._M_len = (size_type)ppVar1;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_158 + 0x10),
             (basic_map<std::allocator<char>_> *)local_158._0_8_,init_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1f8);
  local_10b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_158 + 0x10),&local_1f8);
  local_1f9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {null, 1} }) != variable()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xda6,"void equality_suite::compare_map_null_equal_null()",local_10b,&local_1f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_158 + 0x10));
  local_220 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_158;
  do {
    local_220 = local_220 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_220);
  } while (local_220 != &local_1b8);
  return;
}

Assistant:

void compare_map_null_equal_null()
{
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {null, 1} }) == variable(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {null, 1} }) != variable(), true);
}